

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filemgr.cc
# Opt level: O0

fdb_status filemgr_shutdown(void)

{
  void *pvVar1;
  hash *unaff_retaddr;
  void *open_file;
  fdb_status ret;
  hash *in_stack_00000018;
  fdb_status fVar2;
  undefined4 in_stack_fffffffffffffffc;
  
  fVar2 = FDB_RESULT_SUCCESS;
  if (filemgr_initialized != '\0') {
    pthread_spin_lock(&initial_lock);
    if (filemgr_initialized == '\0') {
      pthread_spin_unlock(&initial_lock);
    }
    else {
      pthread_spin_lock(&filemgr_openlock);
      pvVar1 = hash_scan(in_stack_00000018,_ret,open_file);
      pthread_spin_unlock(&filemgr_openlock);
      if (pvVar1 == (void *)0x0) {
        hash_free_active(unaff_retaddr,(hash_free_func *)CONCAT44(in_stack_fffffffffffffffc,fVar2));
        if (0 < global_config.ncacheblock) {
          bcache_shutdown();
        }
        _filemgr_shutdown_temp_buf();
        pthread_spin_unlock(&initial_lock);
        filemgr_initialized = '\0';
        initial_lock = 1;
      }
      else {
        pthread_spin_unlock(&initial_lock);
        fVar2 = FDB_RESULT_FILE_IS_BUSY;
      }
    }
  }
  return fVar2;
}

Assistant:

fdb_status filemgr_shutdown()
{
    fdb_status ret = FDB_RESULT_SUCCESS;
    void *open_file;
    if (filemgr_initialized) {

#ifndef SPIN_INITIALIZER
        // Windows: check if spin lock is already destroyed.
        if (InterlockedCompareExchange(&initial_lock_status, 1, 2) == 2) {
            spin_lock(&initial_lock);
        } else {
            // filemgr is already shut down
            return ret;
        }
#else
        spin_lock(&initial_lock);
#endif

        if (!filemgr_initialized) {
            // filemgr is already shut down
#ifdef SPIN_INITIALIZER
            spin_unlock(&initial_lock);
#endif
            return ret;
        }

        spin_lock(&filemgr_openlock);
        open_file = hash_scan(&hash, _filemgr_is_closed, NULL);
        spin_unlock(&filemgr_openlock);
        if (!open_file) {
            hash_free_active(&hash, filemgr_free_func);
            if (global_config.ncacheblock > 0) {
                bcache_shutdown();
            }
            _filemgr_shutdown_temp_buf();
            spin_unlock(&initial_lock);
            filemgr_initialized = 0;

#ifndef SPIN_INITIALIZER
            initial_lock_status = 0;
            spin_destroy(&initial_lock);
#else
            initial_lock = SPIN_INITIALIZER;
#endif
        } else {
            spin_unlock(&initial_lock);
            ret = FDB_RESULT_FILE_IS_BUSY;
        }
    }
    return ret;
}